

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

ImVec2 ImGui::TabItemCalcSize(char *label,bool has_close_button)

{
  byte hide_text_after_double_hash;
  byte in_SIL;
  char *in_RDI;
  float fVar1;
  float rhs;
  ImVec2 size;
  ImVec2 label_size;
  ImGuiContext *g;
  ImVec2 local_30;
  ImVec2 local_28;
  ImGuiContext *local_20;
  float in_stack_ffffffffffffffe8;
  ImVec2 in_stack_fffffffffffffff8;
  
  hide_text_after_double_hash = in_SIL & 1;
  local_20 = GImGui;
  local_28 = CalcTextSize((char *)in_stack_fffffffffffffff8,in_RDI,(bool)hide_text_after_double_hash
                          ,in_stack_ffffffffffffffe8);
  fVar1 = (local_20->Style).FramePadding.y;
  ImVec2::ImVec2(&local_30,local_28.x + (local_20->Style).FramePadding.x,fVar1 + fVar1 + local_28.y)
  ;
  if ((hide_text_after_double_hash & 1) == 0) {
    fVar1 = (local_20->Style).FramePadding.x + 1.0;
  }
  else {
    fVar1 = (local_20->Style).FramePadding.x +
            (local_20->Style).ItemInnerSpacing.x + local_20->FontSize;
  }
  local_30.x = fVar1 + local_30.x;
  fVar1 = local_30.x;
  rhs = TabBarCalcMaxTabWidth();
  fVar1 = ImMin<float>(fVar1,rhs);
  ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffff8,fVar1,local_30.y);
  return in_stack_fffffffffffffff8;
}

Assistant:

ImVec2 ImGui::TabItemCalcSize(const char* label, bool has_close_button)
{
    ImGuiContext& g = *GImGui;
    ImVec2 label_size = CalcTextSize(label, NULL, true);
    ImVec2 size = ImVec2(label_size.x + g.Style.FramePadding.x, label_size.y + g.Style.FramePadding.y * 2.0f);
    if (has_close_button)
        size.x += g.Style.FramePadding.x + (g.Style.ItemInnerSpacing.x + g.FontSize); // We use Y intentionally to fit the close button circle.
    else
        size.x += g.Style.FramePadding.x + 1.0f;
    return ImVec2(ImMin(size.x, TabBarCalcMaxTabWidth()), size.y);
}